

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::AddComponentsToCompositesForLoads
          (InterfaceVariableScalarReplacement *this,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_component_values,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_composites,uint32_t depth_to_component)

{
  Instruction *this_00;
  initializer_list<unsigned_int> init_list;
  iterator this_01;
  bool bVar1;
  IRContext *this_02;
  DefUseManager *this_03;
  pointer ppVar2;
  pair<std::__detail::_Node_iterator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false,_false>,_bool>
  pVar3;
  uint32_t local_104;
  iterator local_100;
  undefined8 local_f8;
  SmallVector<unsigned_int,_2UL> local_f0;
  Operand local_c8;
  _Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
  local_98;
  undefined1 local_90;
  pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*> local_88;
  _Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
  local_78;
  _Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
  local_70;
  iterator itr;
  Instruction *composite_construct;
  Instruction *component_value;
  Instruction *load;
  value_type *load_and_component_vale;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
  *__range2;
  DefUseManager *def_use_mgr;
  uint32_t depth_to_component_local;
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
  *loads_to_composites_local;
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
  *loads_to_component_values_local;
  InterfaceVariableScalarReplacement *this_local;
  
  this_02 = Pass::context(&this->super_Pass);
  this_03 = IRContext::get_def_use_mgr(this_02);
  __end2 = std::
           unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
           ::begin(loads_to_component_values);
  load_and_component_vale =
       (value_type *)
       std::
       unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
       ::end(loads_to_component_values);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
                       ,(_Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
                         *)&load_and_component_vale);
    if (!bVar1) break;
    load = (Instruction *)
           std::__detail::
           _Node_const_iterator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false,_false>
           ::operator*(&__end2);
    component_value =
         (Instruction *)
         (load->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase;
    this_00 = (load->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    itr.
    super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
               )(__node_type *)0x0;
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
         ::find(loads_to_composites,&component_value);
    local_78._M_cur =
         (__node_type *)
         std::
         unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
         ::end(loads_to_composites);
    bVar1 = std::__detail::operator==(&local_70,&local_78);
    if (bVar1) {
      itr.
      super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
                 )CreateCompositeConstructForComponentOfLoad
                            (this,component_value,depth_to_component);
      std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>::
      pair<spvtools::opt::Instruction_*&,_spvtools::opt::Instruction_*&,_true>
                (&local_88,&component_value,(Instruction **)&itr);
      pVar3 = std::
              unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
              ::insert(loads_to_composites,&local_88);
      local_98._M_cur =
           (__node_type *)
           pVar3.first.
           super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
           ._M_cur;
      local_90 = pVar3.second;
    }
    else {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false,_false>
                             *)&local_70);
      itr.
      super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
                 )ppVar2->second;
    }
    this_01.
    super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
    ._M_cur = itr.
              super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
              ._M_cur;
    local_104 = Instruction::result_id(this_00);
    local_100 = &local_104;
    local_f8 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_100;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f0,init_list);
    Operand::Operand(&local_c8,SPV_OPERAND_TYPE_ID,&local_f0);
    Instruction::AddOperand
              ((Instruction *)
               this_01.
               super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
               ._M_cur,&local_c8);
    Operand::~Operand(&local_c8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f0);
    analysis::DefUseManager::AnalyzeInstDefUse
              (this_03,(Instruction *)
                       itr.
                       super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
                       ._M_cur);
    std::__detail::
    _Node_const_iterator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false,_false>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::AddComponentsToCompositesForLoads(
    const std::unordered_map<Instruction*, Instruction*>&
        loads_to_component_values,
    std::unordered_map<Instruction*, Instruction*>* loads_to_composites,
    uint32_t depth_to_component) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  for (auto& load_and_component_vale : loads_to_component_values) {
    Instruction* load = load_and_component_vale.first;
    Instruction* component_value = load_and_component_vale.second;
    Instruction* composite_construct = nullptr;
    auto itr = loads_to_composites->find(load);
    if (itr == loads_to_composites->end()) {
      composite_construct =
          CreateCompositeConstructForComponentOfLoad(load, depth_to_component);
      loads_to_composites->insert({load, composite_construct});
    } else {
      composite_construct = itr->second;
    }
    composite_construct->AddOperand(
        {SPV_OPERAND_TYPE_ID, {component_value->result_id()}});
    def_use_mgr->AnalyzeInstDefUse(composite_construct);
  }
}